

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall TTD::SnapshotExtractor::MarkVisitVar(SnapshotExtractor *this,Var var)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  TypeId typeId_00;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  DynamicObject *this_01;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  Type *pTVar8;
  DynamicObject *dynObj;
  RecyclableObject *obj_1;
  RecyclableObject *obj;
  Var var_local;
  SnapshotExtractor *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  obj = (RecyclableObject *)var;
  var_local = this;
  if (var == (Var)0x0) {
    TTDAbort_unrecoverable_error("I don\'t think this should happen but not 100% sure.");
  }
  this_local = (SnapshotExtractor *)var;
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                       ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::TaggedInt::Is(this_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(this_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = Js::UnsafeVarTo<Js::RecyclableObject>(this_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_14 = Js::RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) &&
         (BVar3 = Js::RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = local_14;
    }
  }
  if (0x57 < (int)local_18) {
    this_00 = Js::VarTo<Js::RecyclableObject>(obj);
    BVar3 = Js::RecyclableObject::IsExternal(this_00);
    if (BVar3 == 0) {
      TTDAbort_unrecoverable_error("Not cool.");
    }
  }
  bVar2 = JsSupport::IsVarTaggedInline(obj);
  if (!bVar2) {
    bVar2 = JsSupport::IsVarPrimitiveKind(obj);
    if (bVar2) {
      bVar2 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)3>(&this->m_marks,obj);
      if (bVar2) {
        obj_1 = Js::VarTo<Js::RecyclableObject>(obj);
        pTVar8 = Js::RecyclableObject::GetType(obj_1);
        MarkVisitType(this,pTVar8);
      }
    }
    else {
      bVar2 = JsSupport::IsVarComplexKind(obj);
      if (!bVar2) {
        TTDAbort_unrecoverable_error("Shouldn\'t be anything else");
      }
      bVar2 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)4>(&this->m_marks,obj);
      if (bVar2) {
        dynObj = (DynamicObject *)Js::VarTo<Js::RecyclableObject>(obj);
        typeId_00 = Js::RecyclableObject::GetTypeId((RecyclableObject *)dynObj);
        bVar2 = Js::DynamicType::Is(typeId_00);
        if (bVar2) {
          this_01 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>
                              (&dynObj->super_RecyclableObject);
          pDVar6 = Js::DynamicObject::GetDynamicType(this_01);
          pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
          iVar4 = (*pDVar7->_vptr_DynamicTypeHandler[0x4d])();
          if (iVar4 != 0) {
            pDVar6 = Js::DynamicObject::GetDynamicType(this_01);
            pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
            (*pDVar7->_vptr_DynamicTypeHandler[0x10])(pDVar7,this_01);
          }
        }
        pTVar8 = Js::RecyclableObject::GetType(&dynObj->super_RecyclableObject);
        MarkVisitType(this,pTVar8);
        JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Enqueue
                  (&this->m_worklist,(RecyclableObject **)&dynObj);
      }
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitVar(Js::Var var)
    {
        TTDAssert(var != nullptr, "I don't think this should happen but not 100% sure.");
        TTDAssert(Js::JavascriptOperators::GetTypeId(var) < Js::TypeIds_Limit || Js::VarTo<Js::RecyclableObject>(var)->IsExternal(), "Not cool.");

        //We don't need to visit tagged things
        if(JsSupport::IsVarTaggedInline(var))
        {
            return;
        }

        if(JsSupport::IsVarPrimitiveKind(var))
        {
            if(this->m_marks.MarkAndTestAddr<MarkTableTag::PrimitiveObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);
                this->MarkVisitType(obj->GetType());
            }
        }
        else
        {
            TTDAssert(JsSupport::IsVarComplexKind(var), "Shouldn't be anything else");

            if(this->m_marks.MarkAndTestAddr<MarkTableTag::CompoundObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);

                //do this here instead of in mark visit type as it wants the dynamic object as well
                if(Js::DynamicType::Is(obj->GetTypeId()))
                {
                    Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(obj);
                    if(dynObj->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())
                    {
                        dynObj->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(dynObj);
                    }
                }
                this->MarkVisitType(obj->GetType());

                this->m_worklist.Enqueue(obj);
            }
        }
    }